

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *draw_list;
  ImGuiContext *pIVar3;
  ImGuiID id_00;
  ImGuiWindow *this;
  ImGuiPopupData *pIVar4;
  uint *puVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  ImRect IVar13;
  ImGuiWindow *local_170;
  bool local_165;
  ImGuiWindowFlags local_f8;
  ImGuiWindowFlags flags;
  float local_ec;
  float fStack_e8;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 local_a8;
  ImU32 local_a0;
  ImU32 text_col;
  ImVec2 local_94;
  float local_8c;
  float local_88;
  float extra_w;
  float w_1;
  ImVec2 local_7c;
  float local_74;
  float w;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool menu_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar12 = CalcTextSize(label,(char *)0x0,true,-1.0);
    backed_nav_window._2_1_ = IsPopupOpen(id_00);
    bVar6 = false;
    if (((this->Flags & 0x4000000U) == 0) &&
       (bVar6 = false, (pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      pIVar4 = ImVector<ImGuiPopupData>::operator[]
                         (&pIVar3->OpenPopupStack,(pIVar3->BeginPopupStack).Size);
      IVar1 = pIVar4->OpenParentId;
      puVar5 = ImVector<unsigned_int>::back(&this->IDStack);
      bVar6 = IVar1 == *puVar5;
    }
    pIVar2 = pIVar3->NavWindow;
    if (bVar6) {
      pIVar3->NavWindow = this;
    }
    ImVec2::ImVec2(&pos);
    local_60 = (this->DC).CursorPos;
    backed_nav_window._4_4_ = IVar12.x;
    if ((this->DC).LayoutType == 0) {
      fVar8 = local_60.x - 1.0;
      fVar11 = (pIVar3->Style).ItemSpacing.x;
      fVar9 = local_60.y - (pIVar3->Style).FramePadding.y;
      fVar10 = ImGuiWindow::MenuBarHeight(this);
      ImVec2::ImVec2(&local_68,fVar8 - (float)(int)(fVar11 * 0.5),fVar9 + fVar10);
      pos = local_68;
      (this->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,(pIVar3->Style).ItemSpacing.x * 2.0,
                     (pIVar3->Style).ItemSpacing.y);
      PushStyleVar(0xd,(ImVec2 *)&stack0xffffffffffffff90);
      local_74 = backed_nav_window._4_4_;
      uVar7 = 0;
      if (((enabled ^ 0xffU) & 1) != 0) {
        uVar7 = 8;
      }
      ImVec2::ImVec2(&local_7c,backed_nav_window._4_4_,0.0);
      backed_nav_window._3_1_ = Selectable(label,backed_nav_window._2_1_,uVar7 | 0x300001,&local_7c)
      ;
      PopStyleVar(1);
      (this->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&extra_w,local_60.x,local_60.y - (pIVar3->Style).WindowPadding.y);
      pos = _extra_w;
      local_88 = ImGuiMenuColumns::DeclColumns
                           (&this->MenuColumns,backed_nav_window._4_4_,0.0,
                            (float)(int)(pIVar3->FontSize * 1.2));
      local_94 = GetContentRegionAvail();
      local_8c = ImMax<float>(0.0,local_94.x - local_88);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,local_88,0.0);
      backed_nav_window._3_1_ =
           Selectable(label,backed_nav_window._2_1_,((byte)~enabled & 1) * 8 + 0xb00001,
                      (ImVec2 *)&stack0xffffffffffffff64);
      local_a0 = GetColorU32((byte)~enabled & 1,1.0);
      draw_list = this->DrawList;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,
                     pIVar3->FontSize * 0.3 + (this->MenuColumns).Pos[2] + local_8c,0.0);
      local_a8 = ::operator+(&local_60,(ImVec2 *)&stack0xffffffffffffff50);
      RenderArrow(draw_list,local_a8,local_a0,1,1.0);
    }
    local_165 = false;
    if (enabled) {
      local_165 = ItemHoverable(&(this->DC).LastItemRect,id_00);
    }
    if (bVar6) {
      pIVar3->NavWindow = pIVar2;
    }
    child_menu_window._6_1_ = 0;
    child_menu_window._5_1_ = false;
    if ((this->DC).LayoutType == 1) {
      child_menu_window._4_1_ = false;
      if (((pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size) &&
         (pIVar4 = ImVector<ImGuiPopupData>::operator[]
                             (&pIVar3->OpenPopupStack,(pIVar3->BeginPopupStack).Size),
         pIVar4->SourceWindow == this)) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[]
                           (&pIVar3->OpenPopupStack,(pIVar3->BeginPopupStack).Size);
        local_170 = pIVar4->Window;
      }
      else {
        local_170 = (ImGuiWindow *)0x0;
      }
      if (((pIVar3->HoveredWindow == this) && (local_170 != (ImGuiWindow *)0x0)) &&
         ((this->Flags & 0x400U) == 0)) {
        IVar13 = ImGuiWindow::Rect(local_170);
        ta = IVar13.Min;
        tb = ::operator-(&(pIVar3->IO).MousePos,&(pIVar3->IO).MouseDelta);
        if ((local_170->Pos).x <= (this->Pos).x) {
          tc = ImRect::GetTR((ImRect *)&ta);
        }
        else {
          tc = ImRect::GetTL((ImRect *)&ta);
        }
        if ((local_170->Pos).x <= (this->Pos).x) {
          _fStack_e8 = ImRect::GetBR((ImRect *)&ta);
        }
        else {
          _fStack_e8 = ImRect::GetBL((ImRect *)&ta);
        }
        fVar11 = ImFabs(tb.x - tc.x);
        local_ec = ImClamp<float>(fVar11 * 0.3,5.0,30.0);
        uVar7 = -(uint)((this->Pos).x < (local_170->Pos).x);
        fVar11 = tb.y;
        tb.x = (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) + tb.x;
        fVar8 = ImMax<float>((tc.y - local_ec) - tb.y,-100.0);
        tc.y = fVar11 + fVar8;
        fVar11 = tb.y;
        fVar8 = ImMin<float>((extra + local_ec) - tb.y,100.0);
        extra = fVar11 + fVar8;
        child_menu_window._4_1_ =
             ImTriangleContainsPoint
                       (&tb,&tc,(ImVec2 *)&stack0xffffffffffffff18,&(pIVar3->IO).MousePos);
      }
      if ((((backed_nav_window._2_1_) && (local_165 == false)) &&
          ((pIVar3->HoveredWindow == this &&
           ((pIVar3->HoveredIdPreviousFrame != 0 && (pIVar3->HoveredIdPreviousFrame != id_00))))))
         && (child_menu_window._4_1_ == false)) {
        child_menu_window._5_1_ = true;
      }
      if (((backed_nav_window._2_1_) || (local_165 == false)) || (backed_nav_window._3_1_ == false))
      {
        if (((!backed_nav_window._2_1_) && (local_165 != false)) &&
           (child_menu_window._4_1_ == false)) {
          child_menu_window._6_1_ = 1;
        }
      }
      else {
        child_menu_window._6_1_ = 1;
      }
      if (pIVar3->NavActivateId == id_00) {
        child_menu_window._6_1_ = (backed_nav_window._2_1_ ^ 0xffU) & 1;
        child_menu_window._5_1_ = backed_nav_window._2_1_;
      }
      if (((pIVar3->NavId == id_00) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
         (pIVar3->NavMoveDir == 1)) {
        child_menu_window._6_1_ = 1;
        NavMoveRequestCancel();
      }
    }
    else if (((backed_nav_window._2_1_) && (backed_nav_window._3_1_ != false)) && (bVar6)) {
      child_menu_window._5_1_ = true;
      backed_nav_window._2_1_ = false;
      child_menu_window._6_1_ = 0;
    }
    else if ((backed_nav_window._3_1_ != false) ||
            (((local_165 != false && (bVar6)) && (!backed_nav_window._2_1_)))) {
      child_menu_window._6_1_ = 1;
    }
    else if (((pIVar3->NavId == id_00) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
            (pIVar3->NavMoveDir == 3)) {
      child_menu_window._6_1_ = 1;
      NavMoveRequestCancel();
    }
    if (!enabled) {
      child_menu_window._5_1_ = true;
    }
    if ((child_menu_window._5_1_ != false) && (bVar6 = IsPopupOpen(id_00), bVar6)) {
      ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
    }
    if (((backed_nav_window._2_1_ == false) && (child_menu_window._6_1_ != 0)) &&
       ((pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      OpenPopup(label);
      label_local._7_1_ = false;
    }
    else {
      backed_nav_window._2_1_ = backed_nav_window._2_1_ != false || child_menu_window._6_1_ != 0;
      if (child_menu_window._6_1_ != 0) {
        OpenPopup(label);
      }
      if (backed_nav_window._2_1_) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff0c,0.0,0.0);
        SetNextWindowPos(&pos,1,(ImVec2 *)&stack0xffffffffffffff0c);
        local_f8 = 0x10080145;
        if ((this->Flags & 0x14000000U) != 0) {
          local_f8 = 0x11080145;
        }
        backed_nav_window._2_1_ = BeginPopupEx(id_00,local_f8);
      }
      label_local._7_1_ = backed_nav_window._2_1_;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is choosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - (float)(int)(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
        if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
            flags |= ImGuiWindowFlags_ChildWindow;
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}